

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O2

big_integer * __thiscall big_integer::operator-=(big_integer *this,big_integer *other)

{
  bool bVar1;
  big_integer m;
  big_integer bStack_58;
  big_integer local_38;
  
  if (this->sign == other->sign) {
    bVar1 = compare_without_sign_and_equals(this,other);
    if (bVar1) {
      sub(this,other);
      goto LAB_001463ed;
    }
    big_integer(&local_38,other);
    ::operator-(&bStack_58,&local_38,this);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
    bStack_58.sign = -this->sign;
    swap(this,&bStack_58);
  }
  else if (other->sign == -1) {
    big_integer(&bStack_58,other);
    bStack_58.sign = '\x01';
    operator+=(this,&bStack_58);
  }
  else {
    big_integer(&bStack_58,other);
    bStack_58.sign = -1;
    operator+=(this,&bStack_58);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bStack_58);
LAB_001463ed:
  cutBadZero(this);
  return this;
}

Assistant:

big_integer &big_integer::operator-=(const big_integer &other) {
    if (sign == other.sign) {
        if (this->compare_without_sign_and_equals(other)) {
            sub(*this, other);
        } else {
            big_integer m = other - (*this);
            m.sign = static_cast<int8_t>(sign * (-1));
            swap(*this, m);
        }
    } else if (other.sign == -1) {
        big_integer m(other);
        m.sign = 1;
        *this += m;
    } else {
        big_integer m(other);
        m.sign = -1;
        *this += m;
    }
    cutBadZero();
    return *this;
}